

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printbuf.c
# Opt level: O0

printbuf * printbuf_new(void)

{
  char *pcVar1;
  printbuf *p;
  
  p = (printbuf *)calloc(1,0x10);
  if (p == (printbuf *)0x0) {
    p = (printbuf *)0x0;
  }
  else {
    p->size = 0x20;
    p->bpos = 0;
    pcVar1 = (char *)malloc((long)p->size);
    p->buf = pcVar1;
    if (pcVar1 == (char *)0x0) {
      free(p);
      p = (printbuf *)0x0;
    }
    else {
      *p->buf = '\0';
    }
  }
  return p;
}

Assistant:

struct printbuf *printbuf_new(void)
{
	struct printbuf *p;

	p = (struct printbuf *)calloc(1, sizeof(struct printbuf));
	if (!p)
		return NULL;
	p->size = 32;
	p->bpos = 0;
	if (!(p->buf = (char *)malloc(p->size)))
	{
		free(p);
		return NULL;
	}
	p->buf[0] = '\0';
	return p;
}